

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLMeshLoader.cpp
# Opt level: O0

bool __thiscall COLLADASaxFWL::MeshLoader::initializeOffsets(MeshLoader *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  unsigned_long_long uVar4;
  long in_RDI;
  MeshLoader *unaff_retaddr;
  bool has_errors;
  MeshLoader *in_stack_00000108;
  MeshLoader *in_stack_00000200;
  
  *(undefined8 *)(in_RDI + 400) = 0;
  *(undefined8 *)(in_RDI + 0x1d0) = 0;
  *(undefined4 *)(in_RDI + 0x1d8) = 0;
  *(undefined1 *)(in_RDI + 0x1dc) = 1;
  *(undefined8 *)(in_RDI + 0x1e0) = 0;
  *(undefined4 *)(in_RDI + 0x1e8) = 0;
  *(undefined1 *)(in_RDI + 0x1ec) = 0;
  *(undefined1 *)(in_RDI + 0x1fc) = 0;
  *(undefined1 *)(in_RDI + 0x20c) = 0;
  std::
  vector<COLLADASaxFWL::MeshLoader::PrimitiveInput,_std::allocator<COLLADASaxFWL::MeshLoader::PrimitiveInput>_>
  ::clear((vector<COLLADASaxFWL::MeshLoader::PrimitiveInput,_std::allocator<COLLADASaxFWL::MeshLoader::PrimitiveInput>_>
           *)0xc50d84);
  std::
  vector<COLLADASaxFWL::MeshLoader::PrimitiveInput,_std::allocator<COLLADASaxFWL::MeshLoader::PrimitiveInput>_>
  ::clear((vector<COLLADASaxFWL::MeshLoader::PrimitiveInput,_std::allocator<COLLADASaxFWL::MeshLoader::PrimitiveInput>_>
           *)0xc50d94);
  uVar4 = MeshPrimitiveInputList::getInputArrayMaxOffset((MeshPrimitiveInputList *)(in_RDI + 0x150))
  ;
  *(unsigned_long_long *)(in_RDI + 0x198) = uVar4;
  bVar1 = initializePositionsOffset(in_stack_00000200);
  initializeNormalsOffset(unaff_retaddr);
  bVar2 = initializeColorsOffset(in_stack_00000108);
  bVar3 = initializeTexCoordsOffset(in_stack_00000108);
  initializeTangentsOffset(unaff_retaddr);
  initializeBinormalsOffset(unaff_retaddr);
  return (bVar1 || bVar2) || bVar3;
}

Assistant:

bool MeshLoader::initializeOffsets()
	{
        bool has_errors = false;
        // Reset the members
        mCurrentOffset = 0;
        mPositionsOffset = 0;
        mPositionsIndexOffset = 0;
        mUsePositions = true;
        mNormalsOffset = 0;
        mNormalsIndexOffset = 0;
        mUseNormals = false;
        mUseTangents = false;
        mUseBinormals = false;
        mTexCoordList.clear ();
        mColorList.clear ();

		// We need the maximum offset value of the input elements to calculate the 
		// number of indices for each index list.
		mCurrentMaxOffset = (size_t)mMeshPrimitiveInputs.getInputArrayMaxOffset ();

		// The offset values of the input elements.
        has_errors |= initializePositionsOffset();
        initializeNormalsOffset();
        has_errors |= initializeColorsOffset();
        has_errors |= initializeTexCoordsOffset();
        initializeTangentsOffset();
        initializeBinormalsOffset();
        return has_errors;
	}